

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_encode_options<wchar_t>::~basic_json_encode_options
          (basic_json_encode_options<wchar_t> *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  this->_vptr_basic_json_encode_options = pp_Var1;
  *(void **)((long)&this->_vptr_basic_json_encode_options + (long)pp_Var1[-3]) = vtt[1];
  std::__cxx11::wstring::~wstring((wstring *)&this->new_line_chars_);
  return;
}

Assistant:

~basic_json_encode_options() = default;